

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t checksum(archive_read *a,void *h)

{
  char cVar1;
  int64_t iVar2;
  ulong uStack_40;
  char c;
  size_t i;
  wchar_t sum;
  wchar_t check;
  archive_entry_header_ustar *header;
  uchar *bytes;
  void *h_local;
  archive_read *a_local;
  
  uStack_40 = 0;
  while( true ) {
    if (7 < uStack_40) {
      iVar2 = tar_atol((char *)((long)h + 0x94),8);
      i._4_4_ = 0;
      for (uStack_40 = 0; uStack_40 < 0x94; uStack_40 = uStack_40 + 1) {
        i._4_4_ = (uint)*(byte *)((long)h + uStack_40) + i._4_4_;
      }
      for (; uStack_40 < 0x9c; uStack_40 = uStack_40 + 1) {
        i._4_4_ = i._4_4_ + 0x20;
      }
      for (; uStack_40 < 0x200; uStack_40 = uStack_40 + 1) {
        i._4_4_ = (uint)*(byte *)((long)h + uStack_40) + i._4_4_;
      }
      if ((int)iVar2 == i._4_4_) {
        a_local._4_4_ = L'\x01';
      }
      else {
        i._4_4_ = 0;
        for (uStack_40 = 0; uStack_40 < 0x94; uStack_40 = uStack_40 + 1) {
          i._4_4_ = *(char *)((long)h + uStack_40) + i._4_4_;
        }
        for (; uStack_40 < 0x9c; uStack_40 = uStack_40 + 1) {
          i._4_4_ = i._4_4_ + 0x20;
        }
        for (; uStack_40 < 0x200; uStack_40 = uStack_40 + 1) {
          i._4_4_ = *(char *)((long)h + uStack_40) + i._4_4_;
        }
        if ((int)iVar2 == i._4_4_) {
          a_local._4_4_ = L'\x01';
        }
        else {
          a_local._4_4_ = L'\0';
        }
      }
      return a_local._4_4_;
    }
    cVar1 = *(char *)((long)h + uStack_40 + 0x94);
    if (((cVar1 != ' ') && (cVar1 != '\0')) && ((cVar1 < '0' || ('7' < cVar1)))) break;
    uStack_40 = uStack_40 + 1;
  }
  return L'\0';
}

Assistant:

static int
checksum(struct archive_read *a, const void *h)
{
	const unsigned char *bytes;
	const struct archive_entry_header_ustar	*header;
	int check, sum;
	size_t i;

	(void)a; /* UNUSED */
	bytes = (const unsigned char *)h;
	header = (const struct archive_entry_header_ustar *)h;

	/* Checksum field must hold an octal number */
	for (i = 0; i < sizeof(header->checksum); ++i) {
		char c = header->checksum[i];
		if (c != ' ' && c != '\0' && (c < '0' || c > '7'))
			return 0;
	}

	/*
	 * Test the checksum.  Note that POSIX specifies _unsigned_
	 * bytes for this calculation.
	 */
	sum = (int)tar_atol(header->checksum, sizeof(header->checksum));
	check = 0;
	for (i = 0; i < 148; i++)
		check += (unsigned char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (unsigned char)bytes[i];
	if (sum == check)
		return (1);

	/*
	 * Repeat test with _signed_ bytes, just in case this archive
	 * was created by an old BSD, Solaris, or HP-UX tar with a
	 * broken checksum calculation.
	 */
	check = 0;
	for (i = 0; i < 148; i++)
		check += (signed char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (signed char)bytes[i];
	if (sum == check)
		return (1);

#if DONT_FAIL_ON_CRC_ERROR
	/* Speed up fuzzing by pretending the checksum is always right. */
	return (1);
#else
	return (0);
#endif
}